

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000186f50 = 0x2e2e2e2e2e2e2e;
    uRam0000000000186f57._0_1_ = '.';
    uRam0000000000186f57._1_1_ = '.';
    uRam0000000000186f57._2_1_ = '.';
    uRam0000000000186f57._3_1_ = '.';
    uRam0000000000186f57._4_1_ = '.';
    uRam0000000000186f57._5_1_ = '.';
    uRam0000000000186f57._6_1_ = '.';
    uRam0000000000186f57._7_1_ = '.';
    DAT_00186f40 = '.';
    DAT_00186f40_1._0_1_ = '.';
    DAT_00186f40_1._1_1_ = '.';
    DAT_00186f40_1._2_1_ = '.';
    DAT_00186f40_1._3_1_ = '.';
    DAT_00186f40_1._4_1_ = '.';
    DAT_00186f40_1._5_1_ = '.';
    DAT_00186f40_1._6_1_ = '.';
    uRam0000000000186f48 = 0x2e2e2e2e2e2e2e;
    DAT_00186f4f = 0x2e;
    DAT_00186f30 = '.';
    DAT_00186f30_1._0_1_ = '.';
    DAT_00186f30_1._1_1_ = '.';
    DAT_00186f30_1._2_1_ = '.';
    DAT_00186f30_1._3_1_ = '.';
    DAT_00186f30_1._4_1_ = '.';
    DAT_00186f30_1._5_1_ = '.';
    DAT_00186f30_1._6_1_ = '.';
    uRam0000000000186f38._0_1_ = '.';
    uRam0000000000186f38._1_1_ = '.';
    uRam0000000000186f38._2_1_ = '.';
    uRam0000000000186f38._3_1_ = '.';
    uRam0000000000186f38._4_1_ = '.';
    uRam0000000000186f38._5_1_ = '.';
    uRam0000000000186f38._6_1_ = '.';
    uRam0000000000186f38._7_1_ = '.';
    DAT_00186f20 = '.';
    DAT_00186f20_1._0_1_ = '.';
    DAT_00186f20_1._1_1_ = '.';
    DAT_00186f20_1._2_1_ = '.';
    DAT_00186f20_1._3_1_ = '.';
    DAT_00186f20_1._4_1_ = '.';
    DAT_00186f20_1._5_1_ = '.';
    DAT_00186f20_1._6_1_ = '.';
    uRam0000000000186f28._0_1_ = '.';
    uRam0000000000186f28._1_1_ = '.';
    uRam0000000000186f28._2_1_ = '.';
    uRam0000000000186f28._3_1_ = '.';
    uRam0000000000186f28._4_1_ = '.';
    uRam0000000000186f28._5_1_ = '.';
    uRam0000000000186f28._6_1_ = '.';
    uRam0000000000186f28._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000186f18._0_1_ = '.';
    uRam0000000000186f18._1_1_ = '.';
    uRam0000000000186f18._2_1_ = '.';
    uRam0000000000186f18._3_1_ = '.';
    uRam0000000000186f18._4_1_ = '.';
    uRam0000000000186f18._5_1_ = '.';
    uRam0000000000186f18._6_1_ = '.';
    uRam0000000000186f18._7_1_ = '.';
    DAT_00186f5f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}